

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigReader.h
# Opt level: O0

void ParseToken(config_params *cfp,string *key,string *val)

{
  bool bVar1;
  int iVar2;
  _Ios_Openmode _Var3;
  istream *piVar4;
  double dVar5;
  undefined1 local_890 [8];
  string token_4;
  stringstream is_val_4;
  int local_6e4;
  undefined1 local_6e0 [8];
  string token_3;
  stringstream is_val_3;
  double local_538;
  undefined1 local_530 [8];
  string token_2;
  stringstream is_val_2;
  double local_388;
  undefined1 local_380 [8];
  string token_1;
  stringstream is_val_1;
  undefined1 local_1c8 [8];
  string token;
  stringstream is_val;
  string *val_local;
  string *key_local;
  config_params *cfp_local;
  
  bVar1 = std::operator==(key,"input_files");
  if (bVar1) {
    _Var3 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)(token.field_2._M_local_buf + 8),(string *)val,_Var3);
    std::__cxx11::string::string((string *)local_1c8);
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)(token.field_2._M_local_buf + 8),(string *)local_1c8,',');
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar1) break;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)cfp,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
    }
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::stringstream::~stringstream((stringstream *)(token.field_2._M_local_buf + 8));
  }
  else {
    bVar1 = std::operator==(key,"triangle_count");
    if (bVar1) {
      _Var3 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)(token_1.field_2._M_local_buf + 8),(string *)val,_Var3);
      std::__cxx11::string::string((string *)local_380);
      while( true ) {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)(token_1.field_2._M_local_buf + 8),(string *)local_380,',');
        bVar1 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
        if (!bVar1) break;
        local_388 = std::__cxx11::stod((string *)local_380,(size_t *)0x0);
        std::vector<long_long,_std::allocator<long_long>_>::emplace_back<double>
                  (&cfp->triangle_count,&local_388);
      }
      std::__cxx11::string::~string((string *)local_380);
      std::__cxx11::stringstream::~stringstream((stringstream *)(token_1.field_2._M_local_buf + 8));
    }
    else {
      bVar1 = std::operator==(key,"no_of_repeats");
      if (bVar1) {
        iVar2 = std::__cxx11::stoi(val,(size_t *)0x0,10);
        cfp->no_of_repeats = iVar2;
      }
      else {
        bVar1 = std::operator==(key,"sparsification_prob");
        if (bVar1) {
          _Var3 = std::operator|(_S_out,_S_in);
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)(token_2.field_2._M_local_buf + 8),(string *)val,_Var3);
          std::__cxx11::string::string((string *)local_530);
          while( true ) {
            piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)(token_2.field_2._M_local_buf + 8),(string *)local_530,
                                ',');
            bVar1 = std::ios::operator_cast_to_bool
                              ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
            if (!bVar1) break;
            local_538 = std::__cxx11::stod((string *)local_530,(size_t *)0x0);
            std::vector<double,_std::allocator<double>_>::emplace_back<double>
                      (&cfp->sparsification_prob,&local_538);
          }
          std::__cxx11::string::~string((string *)local_530);
          std::__cxx11::stringstream::~stringstream
                    ((stringstream *)(token_2.field_2._M_local_buf + 8));
        }
        else {
          bVar1 = std::operator==(key,"subsample_prob");
          if (bVar1) {
            dVar5 = std::__cxx11::stod(val,(size_t *)0x0);
            cfp->subsample_prob = dVar5;
          }
          else {
            bVar1 = std::operator==(key,"seed_count");
            if (bVar1) {
              _Var3 = std::operator|(_S_out,_S_in);
              std::__cxx11::stringstream::stringstream
                        ((stringstream *)(token_3.field_2._M_local_buf + 8),(string *)val,_Var3);
              std::__cxx11::string::string((string *)local_6e0);
              while( true ) {
                piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                   ((istream *)(token_3.field_2._M_local_buf + 8),
                                    (string *)local_6e0,',');
                bVar1 = std::ios::operator_cast_to_bool
                                  ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
                if (!bVar1) break;
                local_6e4 = std::__cxx11::stoi((string *)local_6e0,(size_t *)0x0,10);
                std::vector<int,_std::allocator<int>_>::emplace_back<int>
                          (&cfp->seed_count,&local_6e4);
              }
              std::__cxx11::string::~string((string *)local_6e0);
              std::__cxx11::stringstream::~stringstream
                        ((stringstream *)(token_3.field_2._M_local_buf + 8));
            }
            else {
              bVar1 = std::operator==(key,"algo_names");
              if (bVar1) {
                _Var3 = std::operator|(_S_out,_S_in);
                std::__cxx11::stringstream::stringstream
                          ((stringstream *)(token_4.field_2._M_local_buf + 8),(string *)val,_Var3);
                std::__cxx11::string::string((string *)local_890);
                while( true ) {
                  piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                     ((istream *)(token_4.field_2._M_local_buf + 8),
                                      (string *)local_890,',');
                  bVar1 = std::ios::operator_cast_to_bool
                                    ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
                  if (!bVar1) break;
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string&>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &cfp->algo_names,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_890);
                }
                std::__cxx11::string::~string((string *)local_890);
                std::__cxx11::stringstream::~stringstream
                          ((stringstream *)(token_4.field_2._M_local_buf + 8));
              }
              else {
                bVar1 = std::operator==(key,"out_directory");
                if (bVar1) {
                  std::__cxx11::string::operator=((string *)&cfp->out_directory,(string *)val);
                }
                else {
                  bVar1 = std::operator==(key,"print_to_console");
                  if (bVar1) {
                    bVar1 = std::operator==(val,"true");
                    if (bVar1) {
                      cfp->print_to_console = true;
                    }
                    else {
                      bVar1 = std::operator==(val,"false");
                      if (bVar1) {
                        cfp->print_to_console = false;
                      }
                      else {
                        std::operator<<((ostream *)&std::cout,"Unknow token encountered \n");
                      }
                    }
                  }
                  else {
                    bVar1 = std::operator==(key,"print_to_file");
                    if (bVar1) {
                      bVar1 = std::operator==(val,"true");
                      if (bVar1) {
                        cfp->print_to_file = true;
                      }
                      else {
                        bVar1 = std::operator==(val,"false");
                        if (bVar1) {
                          cfp->print_to_file = false;
                        }
                        else {
                          std::operator<<((ostream *)&std::cout,"Unknow token encountered \n");
                        }
                      }
                    }
                    else {
                      bVar1 = std::operator==(key,"normalization_count_available");
                      if (bVar1) {
                        bVar1 = std::operator==(val,"true");
                        if (bVar1) {
                          cfp->edge_count_available = true;
                        }
                        else {
                          bVar1 = std::operator==(val,"false");
                          if (bVar1) {
                            cfp->edge_count_available = false;
                          }
                          else {
                            std::operator<<((ostream *)&std::cout,"Unknow token encountered \n");
                          }
                        }
                      }
                      else {
                        bVar1 = std::operator==(key,"CSS");
                        if (bVar1) {
                          bVar1 = std::operator==(val,"true");
                          if (bVar1) {
                            cfp->CSS = true;
                          }
                          else {
                            bVar1 = std::operator==(val,"false");
                            if (bVar1) {
                              cfp->CSS = false;
                            }
                            else {
                              std::operator<<((ostream *)&std::cout,"Unknow token encountered \n");
                            }
                          }
                        }
                        else {
                          bVar1 = std::operator==(key,"NB");
                          if (bVar1) {
                            bVar1 = std::operator==(val,"true");
                            if (bVar1) {
                              cfp->NB = true;
                            }
                            else {
                              bVar1 = std::operator==(val,"false");
                              if (bVar1) {
                                cfp->NB = false;
                              }
                              else {
                                std::operator<<((ostream *)&std::cout,"Unknow token encountered \n")
                                ;
                              }
                            }
                          }
                          else {
                            bVar1 = std::operator==(key,"degree_bin_seed");
                            if (bVar1) {
                              bVar1 = std::operator==(val,"true");
                              if (bVar1) {
                                cfp->degree_bin_seed = true;
                              }
                              else {
                                bVar1 = std::operator==(val,"false");
                                if (bVar1) {
                                  cfp->degree_bin_seed = false;
                                }
                                else {
                                  std::operator<<((ostream *)&std::cout,
                                                  "Unknow token encountered \n");
                                }
                              }
                            }
                            else {
                              std::operator<<((ostream *)&std::cout,"Unknow token encountered \n");
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ParseToken(config_params& cfp, string key, string val) {

    if (key == "input_files") {
        stringstream is_val (val);
        string token;
        while (getline(is_val,token,','))
            cfp.input_files.emplace_back(token);
    }

    else if (key == "triangle_count") {
        stringstream is_val (val);
        string token;
        while (getline(is_val,token,','))
            cfp.triangle_count.emplace_back(stod(token));
    }

    else if (key == "no_of_repeats")
        cfp.no_of_repeats = stoi(val, nullptr,10);

    else if (key == "sparsification_prob") {
        stringstream is_val (val);
        string token;
        while (getline(is_val,token,','))
            cfp.sparsification_prob.emplace_back(stod(token));
    }

    else if (key == "subsample_prob")
        cfp.subsample_prob = stod(val);

    else if ( key == "seed_count") {
        stringstream is_val (val);
        string token;
        while (getline(is_val,token,','))
            cfp.seed_count.emplace_back(stoi(token));
    }

    else if (key == "algo_names") {
        stringstream is_val (val);
        string token;
        while (getline(is_val,token,','))
            cfp.algo_names.emplace_back(token);
    }

    else if (key == "out_directory") {
        cfp.out_directory = val;
    }

    else if (key == "print_to_console") {
        if (val == "true")
            cfp.print_to_console = true;
        else if (val == "false")
            cfp.print_to_console = false;
        else
            std::cout << "Unknow token encountered \n";
    }
    else if (key == "print_to_file") {
        if (val == "true")
            cfp.print_to_file = true;
        else if (val == "false")
            cfp.print_to_file = false;
        else {
            std::cout << "Unknow token encountered \n" ;
        }
    }

    else if (key == "normalization_count_available") {
        if (val == "true")
            cfp.edge_count_available = true;
        else if (val == "false")
            cfp.edge_count_available = false;
        else {
            std::cout << "Unknow token encountered \n" ;
        }
    }
    else if (key == "CSS") {
        if (val == "true")
            cfp.CSS = true;
        else if (val == "false")
            cfp.CSS = false;
        else {
            std::cout << "Unknow token encountered \n" ;
        }
    }
    else if (key == "NB") {
        if (val == "true")
            cfp.NB = true;
        else if (val == "false")
            cfp.NB = false;
        else {
            std::cout << "Unknow token encountered \n" ;
        }
    }

    else if (key == "degree_bin_seed") {
        if (val == "true")
            cfp.degree_bin_seed = true;
        else if (val == "false")
            cfp.degree_bin_seed = false;
        else {
            std::cout << "Unknow token encountered \n" ;
        }
    }

    else
        std::cout << "Unknow token encountered \n" ;
}